

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O0

void VCProjectWriter::outputFilter(VCProject *project,XmlOutput *xml,QString *filtername)

{
  bool bVar1;
  uint uVar2;
  const_reference pVVar3;
  xml_output *o;
  qsizetype qVar4;
  Node *pNVar5;
  undefined8 in_RDX;
  QString *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int x;
  int i;
  triState parse;
  VCFilter filter;
  QString guid;
  QString extfilter;
  QString name;
  QScopedPointer<Node,_QScopedPointerDeleter<Node>_> root;
  VCFilter *in_stack_fffffffffffff938;
  VCFilter *in_stack_fffffffffffff940;
  QString *in_stack_fffffffffffff948;
  triState v;
  VCProjectSingleConfig *in_stack_fffffffffffff950;
  QString *name_00;
  XmlOutput *in_stack_fffffffffffff958;
  Node *in_stack_fffffffffffff978;
  XmlOutput *in_stack_fffffffffffff990;
  int local_65c;
  int local_658;
  undefined1 local_5e8 [328];
  undefined1 local_4a0 [24];
  undefined1 auStack_488 [24];
  undefined1 auStack_470 [48];
  QList<VCFilterFile> aQStack_440 [41];
  QString local_58;
  QString local_40;
  QString local_28;
  QScopedPointer<Node,_QScopedPointerDeleter<Node>_> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.d = (Node *)0xaaaaaaaaaaaaaaaa;
  QScopedPointer<Node,_QScopedPointerDeleter<Node>_>::QScopedPointer(&local_10,(Node *)0x0);
  pVVar3 = QList<VCProjectSingleConfig>::at
                     ((QList<VCProjectSingleConfig> *)in_stack_fffffffffffff940,
                      (qsizetype)in_stack_fffffffffffff938);
  if ((pVVar3->flat_files & 1U) == 0) {
    in_stack_fffffffffffff990 = (XmlOutput *)operator_new(0x30);
    TreeNode::TreeNode((TreeNode *)in_stack_fffffffffffff940);
    QScopedPointer<Node,_QScopedPointerDeleter<Node>_>::reset
              ((QScopedPointer<Node,_QScopedPointerDeleter<Node>_> *)in_stack_fffffffffffff940,
               (Node *)in_stack_fffffffffffff948);
  }
  else {
    operator_new(0x10);
    FlatNode::FlatNode((FlatNode *)in_stack_fffffffffffff940);
    QScopedPointer<Node,_QScopedPointerDeleter<Node>_>::reset
              ((QScopedPointer<Node,_QScopedPointerDeleter<Node>_> *)in_stack_fffffffffffff940,
               (Node *)in_stack_fffffffffffff948);
  }
  local_28.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_28.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_28.d.size = -0x5555555555555556;
  QString::QString((QString *)0x276be0);
  local_40.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_40.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_40.d.size = -0x5555555555555556;
  QString::QString((QString *)0x276c1a);
  local_58.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_58.d.size = -0x5555555555555556;
  QString::QString((QString *)0x276c54);
  local_658 = 0;
  while( true ) {
    o = (xml_output *)(long)local_658;
    qVar4 = QList<VCProjectSingleConfig>::size((QList<VCProjectSingleConfig> *)(in_RDI + 0xf0));
    if (qVar4 <= (long)o) break;
    memset(local_4a0,0xaa,0x448);
    QList<VCProjectSingleConfig>::at
              ((QList<VCProjectSingleConfig> *)in_stack_fffffffffffff940,
               (qsizetype)in_stack_fffffffffffff938);
    VCProjectSingleConfig::filterByName(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    VCFilter::VCFilter(in_stack_fffffffffffff940,in_stack_fffffffffffff938);
    for (local_65c = 0; qVar4 = QList<VCFilterFile>::size(aQStack_440), local_65c < qVar4;
        local_65c = local_65c + 1) {
      in_stack_fffffffffffff978 =
           QScopedPointer<Node,_QScopedPointerDeleter<Node>_>::operator->(&local_10);
      QList<VCFilterFile>::at
                ((QList<VCFilterFile> *)in_stack_fffffffffffff940,
                 (qsizetype)in_stack_fffffffffffff938);
      ::Node::addElement((Node *)in_stack_fffffffffffff940,(VCFilterFile *)in_stack_fffffffffffff938
                        );
    }
    bVar1 = QString::isEmpty((QString *)0x276d5f);
    if (bVar1) {
      QString::operator=(&local_28,(QString *)local_4a0);
      QString::operator=(&local_40,(QString *)auStack_488);
      QString::operator=(&local_58,(QString *)auStack_470);
    }
    VCFilter::~VCFilter(in_stack_fffffffffffff940);
    local_658 = local_658 + 1;
  }
  pNVar5 = QScopedPointer<Node,_QScopedPointerDeleter<Node>_>::operator->(&local_10);
  uVar2 = (*pNVar5->_vptr_Node[5])();
  if ((uVar2 & 1) != 0) {
    bVar1 = QString::isEmpty((QString *)0x276e08);
    if (!bVar1) {
      name_00 = in_RSI;
      QString::QString(in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff978);
      tag((QString *)in_stack_fffffffffffff958);
      in_stack_fffffffffffff958 = XmlOutput::operator<<(in_stack_fffffffffffff990,o);
      attrS((char *)in_stack_fffffffffffff948,&in_stack_fffffffffffff940->Name);
      XmlOutput::operator<<(in_stack_fffffffffffff990,o);
      attrS((char *)in_stack_fffffffffffff948,&in_stack_fffffffffffff940->Name);
      XmlOutput::operator<<(in_stack_fffffffffffff990,o);
      attrS((char *)in_stack_fffffffffffff948,&in_stack_fffffffffffff940->Name);
      v = (triState)((ulong)in_stack_fffffffffffff948 >> 0x20);
      XmlOutput::operator<<(in_stack_fffffffffffff990,o);
      attrT((char *)name_00,v);
      XmlOutput::operator<<(in_stack_fffffffffffff990,o);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_fffffffffffff940);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_fffffffffffff940);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_fffffffffffff940);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_fffffffffffff940);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_fffffffffffff940);
      QString::~QString((QString *)0x276f6e);
    }
    in_stack_fffffffffffff940 =
         (VCFilter *)QScopedPointer<Node,_QScopedPointerDeleter<Node>_>::operator->(&local_10);
    QString::QString(in_RSI,(char *)in_stack_fffffffffffff978);
    (**(_func_int **)&(in_stack_fffffffffffff940->Name).d.d[2].super_QArrayData)
              (in_stack_fffffffffffff940,in_RSI,local_5e8,in_RDI,in_RDX);
    QString::~QString((QString *)0x276fd3);
    bVar1 = QString::isEmpty((QString *)0x276fe0);
    if (!bVar1) {
      QString::QString(in_RSI,(char *)in_stack_fffffffffffff978);
      closetag((QString *)in_stack_fffffffffffff958);
      XmlOutput::operator<<(in_stack_fffffffffffff990,o);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_fffffffffffff940);
      QString::~QString((QString *)0x277044);
    }
  }
  QString::~QString((QString *)0x277059);
  QString::~QString((QString *)0x277066);
  QString::~QString((QString *)0x277073);
  QScopedPointer<Node,_QScopedPointerDeleter<Node>_>::~QScopedPointer
            ((QScopedPointer<Node,_QScopedPointerDeleter<Node>_> *)in_stack_fffffffffffff940);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void VCProjectWriter::outputFilter(VCProject &project, XmlOutput &xml, const QString &filtername)
{
    QScopedPointer<Node> root;
    if (project.SingleProjects.at(0).flat_files)
        root.reset(new FlatNode);
    else
        root.reset(new TreeNode);

    QString name, extfilter, guid;
    triState parse = unset;

    for (int i = 0; i < project.SingleProjects.size(); ++i) {
        const VCFilter filter = project.SingleProjects.at(i).filterByName(filtername);

        // Merge all files in this filter to root tree
        for (int x = 0; x < filter.Files.size(); ++x)
            root->addElement(filter.Files.at(x));

        // Save filter setting from first filter. Next filters
        // may differ but we cannot handle that. (ex. extfilter)
        if (name.isEmpty()) {
            name = filter.Name;
            extfilter = filter.Filter;
            parse = filter.ParseFiles;
            guid = filter.Guid;
        }
    }

    if (!root->hasElements())
        return;

    // Actual XML output ----------------------------------
    if (!name.isEmpty()) {
        xml << tag(_Filter)
                << attrS(_Name, name)
                << attrS(_Filter, extfilter)
                << attrS(_UniqueIdentifier, guid)
                << attrT(_ParseFiles, parse);
    }
    root->generateXML(xml, "", project, filtername); // output root tree
    if (!name.isEmpty())
        xml << closetag(_Filter);
}